

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb.c
# Opt level: O0

int cubeb_stream_register_device_changed_callback
              (cubeb_stream *stream,cubeb_device_changed_callback device_changed_callback)

{
  undefined8 in_RSI;
  undefined8 *in_RDI;
  undefined4 local_4;
  
  if (in_RDI == (undefined8 *)0x0) {
    local_4 = -3;
  }
  else if (*(long *)(*(long *)*in_RDI + 0x98) == 0) {
    local_4 = -4;
  }
  else {
    local_4 = (**(code **)(*(long *)*in_RDI + 0x98))(in_RDI,in_RSI);
  }
  return local_4;
}

Assistant:

int
cubeb_stream_register_device_changed_callback(
    cubeb_stream * stream,
    cubeb_device_changed_callback device_changed_callback)
{
  if (!stream) {
    return CUBEB_ERROR_INVALID_PARAMETER;
  }

  if (!stream->context->ops->stream_register_device_changed_callback) {
    return CUBEB_ERROR_NOT_SUPPORTED;
  }

  return stream->context->ops->stream_register_device_changed_callback(
      stream, device_changed_callback);
}